

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O0

void Assimp::ExportScenePly
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  DeadlyImportError *pDVar4;
  pointer pIVar5;
  undefined8 uVar6;
  streamoff sVar7;
  fpos local_2b8 [16];
  string local_2a8 [38];
  undefined1 local_282;
  allocator<char> local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_240;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> outfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1e0 [8];
  PlyExporter exporter;
  ExportProperties *param_3_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  exporter.endl.field_2._8_8_ = param_4;
  PlyExporter::PlyExporter((PlyExporter *)local_1e0,pFile,pScene,false);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    outfile._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
    _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
    super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,pFile,
               (allocator<char> *)
               ((long)&outfile._M_t.
                       super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                       .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + 7));
    std::operator+(&local_210,"output data creation failed. Most likely the file became too large: "
                   ,&local_230);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_210);
    outfile._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
    _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
    super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar3 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_240,
             (pointer)CONCAT44(extraout_var,iVar3));
  bVar2 = std::operator==(&local_240,(nullptr_t)0x0);
  if (!bVar2) {
    pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_240);
    std::__cxx11::ostringstream::str();
    uVar6 = std::__cxx11::string::c_str();
    local_2b8 = (fpos  [16])std::ostream::tellp();
    sVar7 = std::fpos::operator_cast_to_long(local_2b8);
    (*pIVar5->_vptr_IOStream[3])(pIVar5,uVar6,sVar7,1);
    std::__cxx11::string::~string(local_2a8);
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              (&local_240);
    PlyExporter::~PlyExporter((PlyExporter *)local_1e0);
    return;
  }
  local_282 = 1;
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,pFile,&local_281);
  std::operator+(&local_260,"could not open output .ply file: ",&local_280);
  DeadlyImportError::DeadlyImportError(pDVar4,&local_260);
  local_282 = 0;
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void ExportScenePly(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/)
{
    // invoke the exporter
    PlyExporter exporter(pFile, pScene);

    if (exporter.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }

    // we're still here - export successfully completed. Write the file.
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .ply file: " + std::string(pFile));
    }

    outfile->Write( exporter.mOutput.str().c_str(), static_cast<size_t>(exporter.mOutput.tellp()),1);
}